

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_expression_abi_cxx11_
          (CompilerGLSL *this,uint32_t id,bool register_expression_read)

{
  bool bVar1;
  Types TVar2;
  uint32_t uVar3;
  Variant *pVVar4;
  SPIRType *pSVar5;
  size_type sVar6;
  string *type_00;
  SPIRExpression *pSVar7;
  CompilerError *pCVar8;
  byte in_CL;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  CompilerGLSL *this_00;
  allocator local_1b9;
  string local_1b8 [38];
  undefined1 local_192;
  allocator local_191;
  string local_190 [32];
  mapped_type *local_170;
  Decoration *dec;
  uint32_t local_144;
  SPIRVariable *pSStack_140;
  uint32_t undef_id;
  SPIRVariable *var;
  pointer local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [35];
  char local_ed;
  int local_ec;
  StorageClass local_e8;
  int wg_index;
  SPIRType *local_e0;
  SPIRType *type;
  SPIRConstant *c;
  string local_c8 [39];
  byte local_a1;
  uint32_t local_a0;
  bool is_packed;
  uint32_t physical_type_id;
  undefined1 local_90 [40];
  SPIRExpression *e;
  _Node_iterator_base<unsigned_int,_false> local_60;
  TypeID local_54;
  TypedID<(spirv_cross::Types)0> *pTStack_50;
  uint32_t dep;
  TypedID<(spirv_cross::Types)0> *__end2;
  TypedID<(spirv_cross::Types)0> *__begin2;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *__range2;
  SPIRExpression *expr;
  _Node_iterator_base<unsigned_int,_false> local_28;
  iterator itr;
  bool register_expression_read_local;
  uint32_t id_local;
  CompilerGLSL *this_local;
  string *wg_size;
  
  this_00 = (CompilerGLSL *)CONCAT44(in_register_00000034,id);
  itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_ =
       (uint32_t)CONCAT71(in_register_00000011,register_expression_read);
  itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._3_1_ = in_CL & 1;
  local_28._M_cur =
       (__node_type *)
       ::std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::find(&(this_00->super_Compiler).invalid_expressions,
              (key_type *)((long)&itr.super__Node_iterator_base<unsigned_int,_false>._M_cur + 4));
  expr = (SPIRExpression *)
         ::std::
         end<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                   (&(this_00->super_Compiler).invalid_expressions);
  bVar1 = ::std::__detail::operator!=(&local_28,(_Node_iterator_base<unsigned_int,_false> *)&expr);
  if (bVar1) {
    handle_invalid_expression
              (this_00,itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_);
  }
  pVVar4 = VectorView<spirv_cross::Variant>::operator[]
                     (&(this_00->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>,
                      (ulong)itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_);
  TVar2 = Variant::get_type(pVVar4);
  if (TVar2 == TypeExpression) {
    __range2 = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)
               Compiler::get<spirv_cross::SPIRExpression>
                         ((Compiler *)this_00,
                          itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_);
    __begin2 = (TypedID<(spirv_cross::Types)0> *)
               &((SPIRExpression *)__range2)->expression_dependencies;
    __end2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::begin
                       ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_> *)__begin2);
    pTStack_50 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::end
                           ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_> *)__begin2);
    for (; __end2 != pTStack_50; __end2 = __end2 + 1) {
      local_54.id = TypedID::operator_cast_to_unsigned_int((TypedID *)__end2);
      local_60._M_cur =
           (__node_type *)
           ::std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::find(&(this_00->super_Compiler).invalid_expressions,&local_54.id);
      e = (SPIRExpression *)
          ::std::
          end<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                    (&(this_00->super_Compiler).invalid_expressions);
      bVar1 = ::std::__detail::operator!=
                        (&stack0xffffffffffffffa0,(_Node_iterator_base<unsigned_int,_false> *)&e);
      if (bVar1) {
        handle_invalid_expression(this_00,local_54.id);
      }
    }
  }
  if ((itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._3_1_ & 1) != 0) {
    track_expression_read(this_00,itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_);
  }
  pVVar4 = VectorView<spirv_cross::Variant>::operator[]
                     (&(this_00->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>,
                      (ulong)itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_);
  TVar2 = Variant::get_type(pVVar4);
  switch(TVar2) {
  case TypeVariable:
    pSStack_140 = Compiler::get<spirv_cross::SPIRVariable>
                            ((Compiler *)this_00,
                             itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_);
    if (((pSStack_140->statically_assigned & 1U) == 0) &&
       (((pSStack_140->loop_variable & 1U) == 0 || ((pSStack_140->loop_variable_enable & 1U) != 0)))
       ) {
      if ((pSStack_140->deferred_declaration & 1U) == 0) {
        sVar6 = ::std::
                unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
                ::count(&this_00->flattened_structs,
                        (key_type *)
                        ((long)&itr.super__Node_iterator_base<unsigned_int,_false>._M_cur + 4));
        if (sVar6 == 0) {
          local_170 = ::std::
                      unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                      ::operator[](&(this_00->super_Compiler).ir.meta,
                                   &(pSStack_140->super_IVariant).self);
          if (((local_170->decoration).builtin & 1U) == 0) {
            (*(this_00->super_Compiler)._vptr_Compiler[6])
                      (this,this_00,
                       (ulong)itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_,1);
          }
          else {
            (*(this_00->super_Compiler)._vptr_Compiler[0x14])
                      (this,this_00,(ulong)(local_170->decoration).builtin_type,
                       (ulong)pSStack_140->storage);
          }
        }
        else {
          (*(this_00->super_Compiler)._vptr_Compiler[6])
                    (&dec,this_00,
                     (ulong)itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_,1);
          uVar3 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(pSStack_140->super_IVariant).field_0xc);
          Compiler::get<spirv_cross::SPIRType>((Compiler *)this_00,uVar3);
          load_flattened_struct(this,(string *)this_00,(SPIRType *)&dec);
          ::std::__cxx11::string::~string((string *)&dec);
        }
      }
      else {
        pSStack_140->deferred_declaration = false;
        (*(this_00->super_Compiler)._vptr_Compiler[0x26])(this,this_00,pSStack_140);
      }
    }
    else {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_140->static_expression);
      if (uVar3 == 0) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_140->initializer);
        if (uVar3 == 0) {
          local_144 = ParsedIR::increase_bound_by(&(this_00->super_Compiler).ir,1);
          uVar3 = Compiler::get_variable_data_type_id((Compiler *)this_00,pSStack_140);
          pSVar7 = emit_uninitialized_temporary_expression(this_00,uVar3,local_144);
          ::std::__cxx11::string::string((string *)this,(string *)&pSVar7->expression);
        }
        else {
          uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_140->initializer);
          to_expression_abi_cxx11_(this,id,SUB41(uVar3,0));
        }
      }
      else {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_140->static_expression);
        to_expression_abi_cxx11_(this,id,SUB41(uVar3,0));
      }
    }
    break;
  case TypeConstant:
    type = (SPIRType *)
           Compiler::get<spirv_cross::SPIRConstant>
                     ((Compiler *)this_00,
                      itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_);
    uVar3 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(((SPIRConstant *)type)->super_IVariant).field_0xc);
    local_e0 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_00,uVar3);
    wg_index = (type->super_IVariant).self.id;
    bVar1 = Compiler::has_decoration((Compiler *)this_00,(ID)wg_index,DecorationBuiltIn);
    if (bVar1) {
      local_e8 = (type->super_IVariant).self.id;
      uVar3 = Compiler::get_decoration((Compiler *)this_00,(ID)local_e8,DecorationBuiltIn);
      (*(this_00->super_Compiler)._vptr_Compiler[0x14])(this,this_00,(ulong)uVar3,8);
    }
    else if (((type->image).format & ImageFormatRgba32f) == ImageFormatUnknown) {
      if (((type->image).format & 0x10000) == ImageFormatUnknown) {
        if ((*(int *)&(local_e0->super_IVariant).field_0xc == 0xf) &&
           (((this_00->backend).can_declare_struct_inline & 1U) == 0)) {
          (*(this_00->super_Compiler)._vptr_Compiler[6])
                    (this,this_00,
                     (ulong)itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_,1);
        }
        else {
          bVar1 = VectorView<unsigned_int>::empty(&(local_e0->array).super_VectorView<unsigned_int>)
          ;
          if ((bVar1) || (((this_00->backend).can_declare_arrays_inline & 1U) != 0)) {
            constant_expression_abi_cxx11_(this,(SPIRConstant *)this_00,SUB81(type,0));
          }
          else {
            (*(this_00->super_Compiler)._vptr_Compiler[6])
                      (this,this_00,
                       (ulong)itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_,1);
          }
        }
      }
      else {
        (*(this_00->super_Compiler)._vptr_Compiler[6])
                  (this,this_00,
                   (ulong)itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_,1);
      }
    }
    else if ((((this_00->backend).workgroup_size_is_hidden & 1U) == 0) ||
            (local_ec = get_constant_mapping_to_workgroup_component(this_00,(SPIRConstant *)type),
            local_ec < 0)) {
      (*(this_00->super_Compiler)._vptr_Compiler[6])
                (this,this_00,(ulong)itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_
                 ,1);
    }
    else {
      local_ed = '\0';
      (*(this_00->super_Compiler)._vptr_Compiler[0x14])(local_110,this_00,0x19);
      local_118 = (pointer)vector_swizzle(1,local_ec);
      join<std::__cxx11::string,char_const*>((spirv_cross *)this,local_110,(char **)&local_118);
      ::std::__cxx11::string::~string((string *)local_110);
      if (*(int *)&(local_e0->super_IVariant).field_0xc != 8) {
        bitcast_expression((CompilerGLSL *)&var,(SPIRType *)this_00,(BaseType)local_e0,(string *)0x8
                          );
        ::std::__cxx11::string::operator=((string *)this,(string *)&var);
        ::std::__cxx11::string::~string((string *)&var);
      }
    }
    break;
  default:
    (*(this_00->super_Compiler)._vptr_Compiler[6])
              (this,this_00,(ulong)itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_,1
              );
    break;
  case TypeExpression:
    local_90._32_8_ =
         Compiler::get<spirv_cross::SPIRExpression>
                   ((Compiler *)this_00,
                    itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_);
    uVar3 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(((SPIRExpression *)local_90._32_8_)->super_IVariant).field_0xc);
    if (uVar3 == 0) {
      if ((*(bool *)(local_90._32_8_ + 0x39) & 1U) == 0) {
        sVar6 = ::std::
                unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
                ::count(&this_00->flattened_structs,
                        (key_type *)
                        ((long)&itr.super__Node_iterator_base<unsigned_int,_false>._M_cur + 4));
        if (sVar6 == 0) {
          bVar1 = Compiler::is_forcing_recompilation((Compiler *)this_00);
          if (bVar1) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)this,"_",(allocator *)((long)&c + 7));
            ::std::allocator<char>::~allocator((allocator<char> *)((long)&c + 7));
          }
          else {
            ::std::__cxx11::string::string((string *)this,(string *)(local_90._32_8_ + 0x10));
          }
        }
        else {
          type_00 = (string *)(local_90._32_8_ + 0x10);
          uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)(local_90._32_8_ + 0x30));
          Compiler::get<spirv_cross::SPIRType>((Compiler *)this_00,uVar3);
          load_flattened_struct(this,(string *)this_00,(SPIRType *)type_00);
        }
      }
      else {
        local_a0 = Compiler::get_extended_decoration
                             ((Compiler *)this_00,
                              itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_,
                              SPIRVCrossDecorationPhysicalTypeID);
        local_a1 = Compiler::has_extended_decoration
                             ((Compiler *)this_00,
                              itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_,
                              SPIRVCrossDecorationPhysicalTypePacked);
        ::std::__cxx11::string::string(local_c8,(string *)(local_90._32_8_ + 0x10));
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)(local_90._32_8_ + 0x30));
        pSVar5 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_00,uVar3);
        (*(this_00->super_Compiler)._vptr_Compiler[0x29])
                  (this,this_00,local_c8,pSVar5,(ulong)local_a0,(ulong)(local_a1 & 1));
        ::std::__cxx11::string::~string(local_c8);
      }
    }
    else {
      uVar3 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&((IVariant *)local_90._32_8_)->field_0xc);
      to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_90,id,SUB41(uVar3,0));
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                      );
      ::std::__cxx11::string::~string((string *)local_90);
    }
    break;
  case TypeConstantOp:
    (*(this_00->super_Compiler)._vptr_Compiler[6])
              (this,this_00,(ulong)itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_,1
              );
    break;
  case TypeCombinedImageSampler:
    local_192 = 1;
    pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_190,"Combined image samplers have no default expression representation.",
               &local_191);
    CompilerError::CompilerError(pCVar8,(string *)local_190);
    local_192 = 0;
    __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case TypeAccessChain:
    pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_1b8,"Access chains have no default expression representation.",&local_1b9);
    CompilerError::CompilerError(pCVar8,(string *)local_1b8);
    __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  return this;
}

Assistant:

string CompilerGLSL::to_expression(uint32_t id, bool register_expression_read)
{
	auto itr = invalid_expressions.find(id);
	if (itr != end(invalid_expressions))
		handle_invalid_expression(id);

	if (ir.ids[id].get_type() == TypeExpression)
	{
		// We might have a more complex chain of dependencies.
		// A possible scenario is that we
		//
		// %1 = OpLoad
		// %2 = OpDoSomething %1 %1. here %2 will have a dependency on %1.
		// %3 = OpDoSomethingAgain %2 %2. Here %3 will lose the link to %1 since we don't propagate the dependencies like that.
		// OpStore %1 %foo // Here we can invalidate %1, and hence all expressions which depend on %1. Only %2 will know since it's part of invalid_expressions.
		// %4 = OpDoSomethingAnotherTime %3 %3 // If we forward all expressions we will see %1 expression after store, not before.
		//
		// However, we can propagate up a list of depended expressions when we used %2, so we can check if %2 is invalid when reading %3 after the store,
		// and see that we should not forward reads of the original variable.
		auto &expr = get<SPIRExpression>(id);
		for (uint32_t dep : expr.expression_dependencies)
			if (invalid_expressions.find(dep) != end(invalid_expressions))
				handle_invalid_expression(dep);
	}

	if (register_expression_read)
		track_expression_read(id);

	switch (ir.ids[id].get_type())
	{
	case TypeExpression:
	{
		auto &e = get<SPIRExpression>(id);
		if (e.base_expression)
			return to_enclosed_expression(e.base_expression) + e.expression;
		else if (e.need_transpose)
		{
			// This should not be reached for access chains, since we always deal explicitly with transpose state
			// when consuming an access chain expression.
			uint32_t physical_type_id = get_extended_decoration(id, SPIRVCrossDecorationPhysicalTypeID);
			bool is_packed = has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypePacked);
			return convert_row_major_matrix(e.expression, get<SPIRType>(e.expression_type), physical_type_id,
			                                is_packed);
		}
		else if (flattened_structs.count(id))
		{
			return load_flattened_struct(e.expression, get<SPIRType>(e.expression_type));
		}
		else
		{
			if (is_forcing_recompilation())
			{
				// During first compilation phase, certain expression patterns can trigger exponential growth of memory.
				// Avoid this by returning dummy expressions during this phase.
				// Do not use empty expressions here, because those are sentinels for other cases.
				return "_";
			}
			else
				return e.expression;
		}
	}

	case TypeConstant:
	{
		auto &c = get<SPIRConstant>(id);
		auto &type = get<SPIRType>(c.constant_type);

		// WorkGroupSize may be a constant.
		if (has_decoration(c.self, DecorationBuiltIn))
			return builtin_to_glsl(BuiltIn(get_decoration(c.self, DecorationBuiltIn)), StorageClassGeneric);
		else if (c.specialization)
		{
			if (backend.workgroup_size_is_hidden)
			{
				int wg_index = get_constant_mapping_to_workgroup_component(c);
				if (wg_index >= 0)
				{
					auto wg_size = join(builtin_to_glsl(BuiltInWorkgroupSize, StorageClassInput), vector_swizzle(1, wg_index));
					if (type.basetype != SPIRType::UInt)
						wg_size = bitcast_expression(type, SPIRType::UInt, wg_size);
					return wg_size;
				}
			}

			return to_name(id);
		}
		else if (c.is_used_as_lut)
			return to_name(id);
		else if (type.basetype == SPIRType::Struct && !backend.can_declare_struct_inline)
			return to_name(id);
		else if (!type.array.empty() && !backend.can_declare_arrays_inline)
			return to_name(id);
		else
			return constant_expression(c);
	}

	case TypeConstantOp:
		return to_name(id);

	case TypeVariable:
	{
		auto &var = get<SPIRVariable>(id);
		// If we try to use a loop variable before the loop header, we have to redirect it to the static expression,
		// the variable has not been declared yet.
		if (var.statically_assigned || (var.loop_variable && !var.loop_variable_enable))
		{
			// We might try to load from a loop variable before it has been initialized.
			// Prefer static expression and fallback to initializer.
			if (var.static_expression)
				return to_expression(var.static_expression);
			else if (var.initializer)
				return to_expression(var.initializer);
			else
			{
				// We cannot declare the variable yet, so have to fake it.
				uint32_t undef_id = ir.increase_bound_by(1);
				return emit_uninitialized_temporary_expression(get_variable_data_type_id(var), undef_id).expression;
			}
		}
		else if (var.deferred_declaration)
		{
			var.deferred_declaration = false;
			return variable_decl(var);
		}
		else if (flattened_structs.count(id))
		{
			return load_flattened_struct(to_name(id), get<SPIRType>(var.basetype));
		}
		else
		{
			auto &dec = ir.meta[var.self].decoration;
			if (dec.builtin)
				return builtin_to_glsl(dec.builtin_type, var.storage);
			else
				return to_name(id);
		}
	}

	case TypeCombinedImageSampler:
		// This type should never be taken the expression of directly.
		// The intention is that texture sampling functions will extract the image and samplers
		// separately and take their expressions as needed.
		// GLSL does not use this type because OpSampledImage immediately creates a combined image sampler
		// expression ala sampler2D(texture, sampler).
		SPIRV_CROSS_THROW("Combined image samplers have no default expression representation.");

	case TypeAccessChain:
		// We cannot express this type. They only have meaning in other OpAccessChains, OpStore or OpLoad.
		SPIRV_CROSS_THROW("Access chains have no default expression representation.");

	default:
		return to_name(id);
	}
}